

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall
Clasp::Solver::otfs(Solver *this,Antecedent *lhs,Antecedent *rhs,Literal p,bool final)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ClauseHead *newC;
  ClauseHead *pCVar4;
  Antecedent *this_00;
  uint in_ECX;
  Solver *in_RDX;
  uint64 *in_RSI;
  Antecedent *in_RDI;
  byte in_R8B;
  BoolPair x;
  ClauseHead *cRhs;
  ClauseHead *cLhs;
  Solver *in_stack_ffffffffffffff78;
  ClauseHead *in_stack_ffffffffffffff80;
  Literal p_00;
  undefined8 in_stack_ffffffffffffff88;
  uint32 data;
  Antecedent in_stack_ffffffffffffff98;
  Literal in_stack_ffffffffffffffa4;
  pair<bool,_bool> local_4a;
  Antecedent local_48;
  uint32 local_40;
  pair<bool,_bool> local_3c;
  pair<bool,_bool> local_3a;
  ClauseHead *local_38;
  undefined7 in_stack_ffffffffffffffd8;
  
  data = (uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  bVar1 = in_R8B & 1;
  newC = Clasp::clause((Antecedent *)in_stack_ffffffffffffff80);
  local_38 = Clasp::clause((Antecedent *)in_stack_ffffffffffffff80);
  std::pair<bool,_bool>::pair<bool,_bool,_true>(&local_3a);
  p_00.rep_ = (uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if (newC != (ClauseHead *)0x0) {
    pCVar4 = newC;
    local_40 = (uint32)Literal::operator~((Literal *)in_stack_ffffffffffffff78);
    iVar3 = (*(newC->super_Constraint)._vptr_Constraint[0x16])
                      (newC,in_RDI,(ulong)local_40,(ulong)((bVar1 ^ 0xff) & 1));
    data = (uint32)((ulong)newC >> 0x20);
    local_3c = SUB42(iVar3,0);
    std::pair<bool,_bool>::operator=(&local_3a,&local_3c);
    if (((local_3a.first & 1U) == 0) || (newC = pCVar4, (local_3a.second & 1U) != 0)) {
      if ((local_3a.first & 1U) == 0) {
        in_stack_ffffffffffffff80 = (ClauseHead *)0x0;
        newC = in_stack_ffffffffffffff80;
      }
      else {
        in_stack_ffffffffffffff80 =
             otfsRemove(in_RDX,(ClauseHead *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                        (LitVec *)pCVar4);
        newC = in_stack_ffffffffffffff80;
      }
    }
    p_00.rep_ = (uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  }
  Antecedent::Antecedent(&local_48,&newC->super_Constraint);
  *in_RSI = local_48.data_;
  if (local_38 != (ClauseHead *)0x0) {
    iVar3 = (*(local_38->super_Constraint)._vptr_Constraint[0x16])
                      (local_38,in_RDI,(ulong)in_ECX,(ulong)((bVar1 ^ 0xff) & 1));
    local_4a = SUB42(iVar3,0);
    std::pair<bool,_bool>::operator=(&local_3a,&local_4a);
    if (((local_3a.first & 1U) == 0) ||
       (((local_3a.second & 1U) != 0 &&
        (pCVar4 = otfsRemove(in_RDX,(ClauseHead *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                             (LitVec *)newC), pCVar4 == (ClauseHead *)0x0)))) {
      if ((local_3a.first & 1U) != 0) {
        this_00 = reason(in_stack_ffffffffffffff78,p_00);
        bVar2 = Antecedent::operator==(this_00,&local_38->super_Constraint);
        if (bVar2) {
          Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffffa0,(Constraint *)0x0);
          setReason((Solver *)in_stack_ffffffffffffff98.data_,in_stack_ffffffffffffffa4,in_RDI,data)
          ;
        }
      }
      local_38 = (ClauseHead *)0x0;
    }
    if ((newC != (ClauseHead *)0x0) && (local_38 != (ClauseHead *)0x0)) {
      bVar2 = ClauseHead::learnt((ClauseHead *)0x1ed61c);
      if (!bVar2) {
        std::swap<Clasp::ClauseHead*>((ClauseHead **)&stack0xffffffffffffffd0,&local_38);
      }
      otfsRemove(in_RDX,(ClauseHead *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(LitVec *)newC);
    }
    Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffff98,&local_38->super_Constraint);
    *in_RSI = in_stack_ffffffffffffff98.data_;
  }
  return;
}

Assistant:

void Solver::otfs(Antecedent& lhs, const Antecedent& rhs, Literal p, bool final) {
	ClauseHead* cLhs = clause(lhs), *cRhs = clause(rhs);
	ClauseHead::BoolPair x;
	if (cLhs) {
		x = cLhs->strengthen(*this, ~p, !final);
		if (!x.first || x.second) {
			cLhs = !x.first ? 0 : otfsRemove(cLhs, 0);
		}
	}
	lhs = cLhs;
	if (cRhs) {
		x = cRhs->strengthen(*this, p, !final);
		if (!x.first || (x.second && otfsRemove(cRhs, 0) == 0)) {
			if (x.first && reason(p) == cRhs) { setReason(p, 0); }
			cRhs = 0;
		}
		if (cLhs && cRhs) {
			// lhs and rhs are now equal - only one of them is needed
			if (!cLhs->learnt()) {
				std::swap(cLhs, cRhs);
			}
			otfsRemove(cLhs, 0);
		}
		lhs = cRhs;
	}
}